

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256-sw.c
# Opt level: O2

void sha256_sw_round(uint round_index,uint32_t *schedule,uint32_t *a,uint32_t *b,uint32_t *c,
                    uint32_t *d,uint32_t *e,uint32_t *f,uint32_t *g,uint32_t *h)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  uVar1 = *e;
  uVar2 = *a;
  uVar3 = *b;
  iVar4 = ((uVar1 << 7 | uVar1 >> 0x19) ^
          (uVar1 << 0x15 | uVar1 >> 0xb) ^ (uVar1 << 0x1a | uVar1 >> 6)) + *h +
          sha256_round_constants[round_index] + schedule[round_index] + ((*f ^ *g) & uVar1 ^ *g);
  uVar1 = *c;
  *d = *d + iVar4;
  *h = ((uVar3 | uVar2) & uVar1 | uVar3 & uVar2) +
       ((uVar2 << 10 | uVar2 >> 0x16) ^
       (uVar2 << 0x13 | uVar2 >> 0xd) ^ (uVar2 << 0x1e | uVar2 >> 2)) + iVar4;
  return;
}

Assistant:

static inline void sha256_sw_round(
    unsigned round_index, const uint32_t *schedule,
    uint32_t *a, uint32_t *b, uint32_t *c, uint32_t *d,
    uint32_t *e, uint32_t *f, uint32_t *g, uint32_t *h)
{
    uint32_t t1 = *h + Sigma_1(*e) + Ch(*e,*f,*g) +
        sha256_round_constants[round_index] + schedule[round_index];

    uint32_t t2 = Sigma_0(*a) + Maj(*a,*b,*c);

    *d += t1;
    *h = t1 + t2;
}